

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall
embree::TutorialScene::add(TutorialScene *this,Ref<embree::SceneGraph::GroupNode> *group)

{
  pointer pRVar1;
  Node *pNVar2;
  pointer __x;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cameraNode;
  Ref<embree::SceneGraph::LightNode> lightNode;
  value_type local_50;
  value_type local_48;
  TutorialScene *local_40;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  *local_38;
  
  __x = (group->ptr->children).
        super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (group->ptr->children).
           super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__x != pRVar1) {
    local_38 = &this->lights;
    local_40 = this;
    do {
      pNVar2 = __x->ptr;
      if (pNVar2 == (Node *)0x0) {
        local_48.ptr = (LightNode *)0x0;
LAB_00139afc:
        local_50.ptr = (PerspectiveCameraNode *)0x0;
        goto LAB_00139b4f;
      }
      local_48.ptr = (LightNode *)
                     __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                    &SceneGraph::LightNode::typeinfo,0);
      if (local_48.ptr == (LightNode *)0x0) {
LAB_00139b0f:
        local_50.ptr = (PerspectiveCameraNode *)
                       __dynamic_cast(pNVar2,&SceneGraph::Node::typeinfo,
                                      &SceneGraph::PerspectiveCameraNode::typeinfo,0);
        if (local_50.ptr == (PerspectiveCameraNode *)0x0) {
LAB_00139b4f:
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          ::push_back(&this->geometries,__x);
        }
        else {
          (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(local_50.ptr);
          if (local_50.ptr == (PerspectiveCameraNode *)0x0) goto LAB_00139b4f;
          std::
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ::push_back(&local_40->cameras,&local_50);
        }
        if (local_50.ptr != (PerspectiveCameraNode *)0x0) {
          (*((local_50.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
      }
      else {
        (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(local_48.ptr);
        if (local_48.ptr == (LightNode *)0x0) {
          pNVar2 = __x->ptr;
          if (pNVar2 == (Node *)0x0) goto LAB_00139afc;
          goto LAB_00139b0f;
        }
        std::
        vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
        ::push_back(local_38,&local_48);
      }
      if (local_48.ptr != (LightNode *)0x0) {
        (*((local_48.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      __x = __x + 1;
    } while (__x != pRVar1);
  }
  return;
}

Assistant:

void TutorialScene::add(Ref<SceneGraph::GroupNode> group) 
  {
    for (auto& node : group->children) 
    {
      if (Ref<SceneGraph::LightNode> lightNode = node.dynamicCast<SceneGraph::LightNode>()) {
        lights.push_back(lightNode);
      } 
      else if (Ref<SceneGraph::PerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>()) {
        cameras.push_back(cameraNode);
      } 
      else {
        geometries.push_back(node);
      }
    }
  }